

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_rbtree.c
# Opt level: O2

RBTNode * rbt_leftmost(RBTree *rbt)

{
  RBTNode *pRVar1;
  RBTNode *pRVar2;
  RBTNode *pRVar3;
  
  pRVar2 = rbt->root;
  pRVar3 = rbt->root;
  while (pRVar1 = pRVar2, pRVar1 != &g_sentinel) {
    pRVar3 = pRVar1;
    pRVar2 = pRVar1->left;
  }
  pRVar2 = (RBTNode *)0x0;
  if (pRVar3 != &g_sentinel) {
    pRVar2 = pRVar3;
  }
  return pRVar2;
}

Assistant:

RBTNode *
rbt_leftmost(RBTree *rbt)
{
    RBTNode    *node = rbt->root;
    RBTNode    *leftmost = rbt->root;

    while (node != RBTNIL)
    {
        leftmost = node;
        node = node->left;
    }

    if (leftmost != RBTNIL)
        return leftmost;

    return NULL;
}